

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O0

void __thiscall QKeySequenceEditPrivate::resetState(QKeySequenceEditPrivate *this)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QLineEdit *this_00;
  QString *placeholderText;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QBasicTimer::isActive((QBasicTimer *)(in_RDI + 0x284));
  if (bVar1) {
    QBasicTimer::stop();
  }
  *(undefined4 *)(in_RDI + 0x280) = 0xffffffff;
  this_00 = *(QLineEdit **)(in_RDI + 600);
  placeholderText = &local_20;
  uVar2 = 0;
  QKeySequence::toString((SequenceFormat)placeholderText);
  QLineEdit::setText(this_00,(QString *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QString::~QString((QString *)0x5a6a78);
  QKeySequenceEdit::tr((char *)placeholderText,(char *)this_00,in_stack_ffffffffffffff8c);
  QLineEdit::setPlaceholderText
            ((QLineEdit *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),placeholderText);
  QString::~QString((QString *)0x5a6ac3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKeySequenceEditPrivate::resetState()
{
    if (releaseTimer.isActive())
        releaseTimer.stop();
    prevKey = -1;
    lineEdit->setText(keySequence.toString(QKeySequence::NativeText));
    lineEdit->setPlaceholderText(QKeySequenceEdit::tr("Press shortcut"));
}